

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O2

void anurbs::Ref<anurbs::BrepLoop>::register_python(module *m)

{
  class_<anurbs::Ref<anurbs::BrepLoop>> *pcVar1;
  string name;
  type local_92;
  type local_91;
  class_<anurbs::Ref<anurbs::BrepLoop>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  code *local_48;
  undefined8 local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  code *local_18;
  undefined8 local_10;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Ref",(allocator<char> *)&local_48);
  BrepLoop::type_name_abi_cxx11_();
  std::operator+(&local_38,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  pybind11::class_<anurbs::Ref<anurbs::BrepLoop>_>::class_<>
            (&local_90,(m->super_object).super_handle.m_ptr,local_38._M_dataplus._M_p);
  pcVar1 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def<anurbs::Ref<anurbs::BrepLoop>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::BrepLoop>const&)_1_>
                     ((class_<anurbs::Ref<anurbs::BrepLoop>> *)&local_90,"__len__",&local_91);
  pcVar1 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def<anurbs::Ref<anurbs::BrepLoop>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::BrepLoop>const&,int)_1_>
                     (pcVar1,"__getitem__",&local_92);
  local_68._M_dataplus._M_p = (pointer)key_abi_cxx11_;
  local_68._M_string_length = 0;
  pcVar1 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::BrepLoop>::*)()const>
                     (pcVar1,"key",(offset_in_Model_to_subr *)&local_68);
  local_88._M_dataplus._M_p = (pointer)type_name_abi_cxx11_;
  local_88._M_string_length = 0;
  pcVar1 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::BrepLoop>::*)()const>
                     (pcVar1,"type",(offset_in_Model_to_subr *)&local_88);
  local_48 = data;
  local_40 = 0;
  pcVar1 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def_property_readonly<std::shared_ptr<anurbs::BrepLoop>(anurbs::Ref<anurbs::BrepLoop>::*)()const>
                     (pcVar1,"data",(offset_in_Model_to_subr *)&local_48);
  local_18 = attributes;
  local_10 = 0;
  pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
  def_property_readonly<std::shared_ptr<anurbs::Attributes>(anurbs::Ref<anurbs::BrepLoop>::*)()const>
            (pcVar1,"attributes",(offset_in_Model_to_subr *)&local_18);
  pybind11::object::~object((object *)&local_90);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = std::string("Ref") + TData::type_name();

        py::class_<Type>(m, name.c_str())
            // methods
            .def("__len__", [](const Type& self) { return 2; })
            .def("__getitem__", [](const Type& self, const int i) -> py::object {
                switch (i) {
                case 0:
                    return py::cast(self.key());
                case 1:
                    return py::cast(self.data());
                default:
                    throw py::index_error();
                }
            })
            // read-only properties
            .def_property_readonly("key", &Type::key)
            .def_property_readonly("type", &Type::type_name)
            .def_property_readonly("data", &Type::data)
            .def_property_readonly("attributes", &Type::attributes)
        ;
    }